

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
          (QMovableArrayOps<QVariant> *this,qsizetype i,QVariant *args)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QVariant *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_70;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size == i) {
      qVar5 = QArrayDataPointer<QVariant>::freeSpaceAtEnd((QArrayDataPointer<QVariant> *)this);
      if (qVar5 == 0) goto LAB_0011950c;
      QVariant::QVariant((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.
                         ptr + (this->super_QGenericArrayOps<QVariant>).
                               super_QArrayDataPointer<QVariant>.size,args);
LAB_0011962d:
      pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001195ec;
    }
LAB_0011950c:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QVariant>::freeSpaceAtBegin((QArrayDataPointer<QVariant> *)this);
      if (qVar5 != 0) {
        QVariant::QVariant((this->super_QGenericArrayOps<QVariant>).
                           super_QArrayDataPointer<QVariant>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0011962d;
      }
    }
  }
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)&local_48,args);
  bVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
  QArrayDataPointer<QVariant>::detachAndGrow
            ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar6),1,(QVariant **)0x0,
             (QArrayDataPointer<QVariant> *)0x0);
  if (i == 0 && bVar6) {
    pQVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
    *(undefined8 *)((long)&pQVar4[-1].d.data + 0x10) = local_48._16_8_;
    *(undefined1 **)&pQVar4[-1].d.field_0x18 = puStack_30;
    pQVar4[-1].d.data.shared = local_48.shared;
    *(undefined8 *)((long)&pQVar4[-1].d.data + 8) = local_48._8_8_;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    puStack_30 = (undefined1 *)0x2;
    ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QVariant> *)this,i,1);
    *(undefined8 *)((long)&((local_70.displaceFrom)->d).data + 0x10) = local_48._16_8_;
    *(undefined1 **)&((local_70.displaceFrom)->d).field_0x18 = puStack_30;
    ((local_70.displaceFrom)->d).data.shared = local_48.shared;
    *(undefined8 *)((long)&((local_70.displaceFrom)->d).data + 8) = local_48._8_8_;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    puStack_30 = (undefined1 *)0x2;
    local_70.displaceFrom = local_70.displaceFrom + 1;
    Inserter::~Inserter(&local_70);
  }
  QVariant::~QVariant((QVariant *)&local_48);
LAB_001195ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }